

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.h
# Opt level: O0

void __thiscall
HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::HashtableTest(HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *this)

{
  allocator_type *in_RDI;
  int in_stack_ffffffffffffffac;
  allocator_type *eql;
  Test *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffffd0;
  
  testing::Test::Test(in_stack_ffffffffffffffc0);
  *(undefined ***)in_RDI = &PTR__HashtableTest_013016c8;
  eql = in_RDI + 1;
  TransparentHasher::TransparentHasher((TransparentHasher *)in_RDI,in_stack_ffffffffffffffac);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_RDI,in_stack_ffffffffffffffac);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)&stack0xffffffffffffffc0,0,
             (int *)0x0);
  google::
  HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8,
             (hasher *)in_stack_ffffffffffffffc0,(key_equal *)eql,in_RDI);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

HashtableTest() : ht_() {}